

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpConnection::handle_read
          (TcpConnection *this,error_code *error,size_t bytes_transferred)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  unsigned_long uVar4;
  __int_type_conflict3 _Var5;
  char *pcVar6;
  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
  *this_00;
  long in_RDX;
  TcpConnection *in_RSI;
  long in_RDI;
  unsigned_long used_1;
  unsigned_long used;
  enable_shared_from_this<gmlc::networking::TcpConnection> *in_stack_fffffffffffffe08;
  ConnectionStates CVar7;
  error_code *in_stack_fffffffffffffe10;
  TriggerVariable *in_stack_fffffffffffffe18;
  TcpConnection *pTVar8;
  TcpConnection *in_stack_fffffffffffffe20;
  error_code *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  TcpConnection *in_stack_fffffffffffffe90;
  allocator<char> local_d9 [129];
  unsigned_long local_58;
  undefined1 local_3d;
  unsigned_long local_20;
  long local_18;
  TcpConnection *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = std::atomic<bool>::load
                    (&in_stack_fffffffffffffe18->triggered,
                     (memory_order)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  if (bVar2) {
    std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
              ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
               in_stack_fffffffffffffe10,
               (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    concurrency::TriggerVariable::trigger(in_stack_fffffffffffffe18);
  }
  else {
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)local_10);
    if (bVar2) {
      pTVar8 = local_10;
      std::error_code::error_code<asio::error::basic_errors,void>
                ((error_code *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (basic_errors)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      bVar2 = std::operator==((error_code *)in_stack_fffffffffffffe20,
                              (error_code *)in_stack_fffffffffffffe18);
      if (bVar2) {
        std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                  ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                   in_stack_fffffffffffffe10,
                   (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        concurrency::TriggerVariable::trigger(in_stack_fffffffffffffe18);
      }
      else {
        if (local_18 != 0) {
          std::enable_shared_from_this<gmlc::networking::TcpConnection>::shared_from_this
                    (in_stack_fffffffffffffe08);
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x6f4fef);
          std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
          uVar4 = std::
                  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                  ::operator()((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                                *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                               (shared_ptr<gmlc::networking::TcpConnection> *)
                               in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                               (unsigned_long)in_stack_fffffffffffffe18);
          std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                    ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f5045);
          lVar1 = local_18;
          local_58 = uVar4;
          _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
          if (uVar4 < lVar1 + _Var5) {
            if (local_58 != 0) {
              pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x6f50b9);
              in_stack_fffffffffffffe48 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pcVar6 + local_58);
              pcVar6 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x6f50d7);
              in_stack_fffffffffffffe40 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pcVar6 + local_18);
              _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                                ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
              in_stack_fffffffffffffe50 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(in_stack_fffffffffffffe40->_M_dataplus)._M_p + _Var5);
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0x6f5116);
              std::copy<char*,char*>
                        ((char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                         (char *)in_stack_fffffffffffffe10);
            }
            std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
            std::__atomic_base<unsigned_long>::operator=
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe20,
                       (__int_type_conflict3)in_stack_fffffffffffffe18);
          }
          else {
            std::__atomic_base<unsigned_long>::operator=
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe20,
                       (__int_type_conflict3)in_stack_fffffffffffffe18);
          }
        }
        bVar2 = std::function::operator_cast_to_bool
                          ((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                            *)0x6f51bc);
        if (bVar2) {
          this_00 = (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                     *)(in_RDI + 0x1f8);
          std::enable_shared_from_this<gmlc::networking::TcpConnection>::shared_from_this
                    (in_stack_fffffffffffffe08);
          CVar7 = (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20);
          bVar3 = std::
                  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                  ::operator()(this_00,(shared_ptr<gmlc::networking::TcpConnection> *)
                                       in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                    ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f5217);
          if ((bVar3 & 1) == 0) {
            std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                      ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                       in_stack_fffffffffffffe10,CVar7);
            concurrency::TriggerVariable::trigger(in_stack_fffffffffffffe18);
          }
          else {
            std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                      ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                       in_stack_fffffffffffffe10,CVar7);
            startReceive(pTVar8);
          }
        }
        else {
          pTVar8 = local_10;
          std::error_code::error_code<asio::error::misc_errors,void>
                    ((error_code *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                     (misc_errors)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          CVar7 = (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20);
          bVar2 = std::operator==((error_code *)in_stack_fffffffffffffe20,(error_code *)pTVar8);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                      ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                       in_stack_fffffffffffffe10,CVar7);
            concurrency::TriggerVariable::trigger((TriggerVariable *)pTVar8);
          }
          else {
            std::error_code::error_code<asio::error::basic_errors,void>
                      ((error_code *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                       (basic_errors)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            bVar2 = std::operator==((error_code *)in_stack_fffffffffffffe20,(error_code *)pTVar8);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              CVar7 = (ConnectionStates)((ulong)local_d9 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                         (allocator<char> *)in_stack_fffffffffffffe40);
              std::error_code::message_abi_cxx11_(in_stack_fffffffffffffe28);
              std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
              logger(in_stack_fffffffffffffe20,(int)((ulong)pTVar8 >> 0x20),(string *)local_10);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_10);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_10);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_10);
              std::allocator<char>::~allocator(local_d9);
            }
            std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                      ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)local_10,CVar7);
            concurrency::TriggerVariable::trigger((TriggerVariable *)pTVar8);
          }
        }
      }
    }
    else {
      std::enable_shared_from_this<gmlc::networking::TcpConnection>::shared_from_this
                (in_stack_fffffffffffffe08);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x6f4ce6);
      std::__atomic_base::operator_cast_to_unsigned_long
                ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
      uVar4 = std::
              function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
              ::operator()((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                            *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                           (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe28,
                           (char *)in_stack_fffffffffffffe20,
                           (unsigned_long)in_stack_fffffffffffffe18);
      std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f4d4e);
      local_20 = uVar4;
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
      if (uVar4 < local_18 + _Var5) {
        if (local_20 != 0) {
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x6f4dce);
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x6f4def);
          std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x6f4e37);
          std::copy<char*,char*>
                    ((char *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                     (char *)in_stack_fffffffffffffe10);
        }
        CVar7 = (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20);
        std::__atomic_base::operator_cast_to_unsigned_long
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe18);
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe20,
                   (__int_type_conflict3)in_stack_fffffffffffffe18);
      }
      else {
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe20,
                   (__int_type_conflict3)in_stack_fffffffffffffe18);
        CLI::std::vector<char,_std::allocator<char>_>::size
                  ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x30));
        local_3d = 0;
        std::vector<char,_std::allocator<char>_>::assign
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe10,
                   (size_type)in_stack_fffffffffffffe08,(value_type_conflict1 *)0x6f4f13);
        CVar7 = (ConnectionStates)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      }
      std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                 in_stack_fffffffffffffe10,CVar7);
      startReceive(in_stack_fffffffffffffe90);
    }
  }
  return;
}

Assistant:

void TcpConnection::handle_read(
    const std::error_code& error,
    size_t bytes_transferred)
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    }
    if (!error) {
        auto used = dataCall(
            shared_from_this(),
            data.data(),
            bytes_transferred + residBufferSize);
        if (used < (bytes_transferred + residBufferSize)) {
            if (used > 0) {
                std::copy(
                    data.data() + used,
                    data.data() + bytes_transferred + residBufferSize,
                    data.data());
            }
            residBufferSize = bytes_transferred + residBufferSize - used;
        } else {
            residBufferSize = 0;
            data.assign(data.size(), 0);
        }
        state = ConnectionStates::WAITING;
        startReceive();
    } else if (error == asio::error::operation_aborted) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    } else {
        // there was an error
        if (bytes_transferred > 0) {
            auto used = dataCall(
                shared_from_this(),
                data.data(),
                bytes_transferred + residBufferSize);
            if (used < (bytes_transferred + residBufferSize)) {
                if (used > 0) {
                    std::copy(
                        data.data() + used,
                        data.data() + bytes_transferred + residBufferSize,
                        data.data());
                }
                residBufferSize = bytes_transferred + residBufferSize - used;
            } else {
                residBufferSize = 0;
            }
        }
        if (errorCall) {
            if (errorCall(shared_from_this(), error)) {
                state = ConnectionStates::WAITING;
                startReceive();
            } else {
                state = ConnectionStates::HALTED;
                receivingHalt.trigger();
            }
        } else if (error != asio::error::eof) {
            if (error != asio::error::connection_reset) {
                logger(0, std::string("receive error ") + error.message());
            }
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        } else {
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        }
    }
}